

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O3

bool embree::TutorialBenchmark::benchmark(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  allocator local_59;
  char **local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (argc < 1) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
    uVar2 = 1;
    local_58 = argv;
    do {
      std::__cxx11::string::string((string *)local_50,local_58[uVar2 - 1],&local_59);
      iVar1 = std::__cxx11::string::compare((char *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if (iVar1 == 0) {
        return bVar3;
      }
      bVar3 = uVar2 < (uint)argc;
      bVar4 = uVar2 != (uint)argc;
      uVar2 = uVar2 + 1;
    } while (bVar4);
  }
  return bVar3;
}

Assistant:

static bool benchmark(int argc, char** argv) {
    for (int i = 0; i < argc; ++i)
      if (std::string(argv[i]) == "--benchmark")
        return true;
    return false;
  }